

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

_Bool get_global(ch_context *context,ch_string *name)

{
  _Bool _Var1;
  undefined1 extraout_AL;
  ch_primitive *pcVar2;
  ch_primitive entry;
  
  pcVar2 = ch_table_get(&context->globals,name);
  if (pcVar2 != (ch_primitive *)0x0) {
    entry._4_4_ = 0;
    entry.type = pcVar2->type;
    entry.field_1 =
         (anon_union_8_4_dd993ae3_for_ch_primitive_1)
         (anon_union_8_4_dd993ae3_for_ch_primitive_1)(pcVar2->field_1).object_value;
    _Var1 = ch_stack_push(&context->stack,entry);
    return _Var1;
  }
  ch_runtime_error(context,EXIT_GLOBAL_NOT_FOUND,"Global variable does not exist: %s.",name->value);
  return (_Bool)extraout_AL;
}

Assistant:

static bool get_global(ch_context* context, ch_string* name) {
  ch_primitive *global = ch_table_get(&context->globals, name);
  if (global == NULL) {
    ch_runtime_error(context, EXIT_GLOBAL_NOT_FOUND,
                      "Global variable does not exist: %s.", name->value);
    return false;
  }

  ch_stack_push(&context->stack, *global);
  return true;
}